

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_laplace.cpp
# Opt level: O1

Reals __thiscall
Omega_h::solve_laplacian(Omega_h *this,Mesh *mesh,Reals *initial,Int width,Real tol,Real floor)

{
  int *piVar1;
  Alloc *pAVar2;
  bool bVar3;
  LO LVar4;
  I32 IVar5;
  ostream *poVar6;
  undefined8 uVar7;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *extraout_RDX_07;
  void *extraout_RDX_08;
  void *pvVar8;
  char *pcVar9;
  size_t sVar10;
  ulong uVar11;
  bool bVar12;
  Reals RVar13;
  Reals new_state;
  Read<signed_char> boundary;
  Write<double> new_state_w;
  LOs b2v;
  Reals new_state_nobc;
  Read<double> bc_data;
  Reals weights;
  Read<signed_char> interior;
  CommPtr comm;
  Graph star;
  undefined1 local_230 [36];
  int local_20c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  Alloc *local_1f8;
  void *local_1f0;
  Alloc *local_1e8;
  void *local_1e0;
  Reals local_1d8;
  Reals local_1c8;
  Alloc *local_1b8;
  element_type *local_1b0;
  Write<double> local_1a8;
  Write<signed_char> local_198;
  LOs local_188;
  Read<signed_char> local_178;
  Read<signed_char> local_168;
  Reals local_158;
  Reals local_148;
  LOs local_138;
  Graph local_128;
  Alloc *local_108;
  void *local_100;
  Read<signed_char> local_f8;
  Alloc *local_e8;
  void *local_e0;
  Read<double> local_d8;
  Read<signed_char> local_c8;
  Alloc *local_b8;
  pointer local_b0;
  Comm *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  Graph local_98;
  Alloc *local_78;
  element_type *peStack_70;
  Real local_60;
  Real local_58;
  Write<signed_char> local_50;
  Read<signed_char> local_40;
  
  local_60 = tol;
  local_58 = floor;
  bVar3 = Mesh::owners_have_all_upward(mesh,0);
  if (bVar3) {
    pAVar2 = (initial->write_).shared_alloc_.alloc;
    if (((ulong)pAVar2 & 1) == 0) {
      sVar10 = pAVar2->size;
    }
    else {
      sVar10 = (ulong)pAVar2 >> 3;
    }
    LVar4 = Mesh::nverts(mesh);
    if (LVar4 * width == (int)(sVar10 >> 3)) {
      Mesh::comm(mesh);
      pAVar2 = (initial->write_).shared_alloc_.alloc;
      *(Alloc **)this = pAVar2;
      if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          *(size_t *)this = pAVar2->size * 8 + 1;
        }
        else {
          pAVar2->use_count = pAVar2->use_count + 1;
        }
      }
      *(void **)(this + 8) = (initial->write_).shared_alloc_.direct_ptr;
      Mesh::ask_star(&local_98,mesh,0);
      if ((uint)mesh->dim_ < 4) {
        mark_by_class_dim((Omega_h *)&local_b8,mesh,0,mesh->dim_);
        local_40.write_.shared_alloc_.alloc = local_b8;
        if (((ulong)local_b8 & 7) == 0 && local_b8 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_40.write_.shared_alloc_.alloc = (Alloc *)(local_b8->size * 8 + 1);
          }
          else {
            local_b8->use_count = local_b8->use_count + 1;
          }
        }
        local_40.write_.shared_alloc_.direct_ptr = local_b0;
        invert_marks((Omega_h *)local_208._M_local_buf,&local_40);
        pAVar2 = local_40.write_.shared_alloc_.alloc;
        if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
            local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_40.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_40.write_.shared_alloc_.alloc);
            operator_delete(pAVar2,0x48);
          }
        }
        local_c8.write_.shared_alloc_.alloc = (Alloc *)local_208._M_allocated_capacity;
        if ((local_208._M_allocated_capacity & 7) == 0 &&
            (Alloc *)local_208._M_allocated_capacity != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_c8.write_.shared_alloc_.alloc =
                 (Alloc *)(*(long *)local_208._M_allocated_capacity * 8 + 1);
          }
          else {
            *(int *)(local_208._M_allocated_capacity + 0x30) =
                 *(int *)(local_208._M_allocated_capacity + 0x30) + 1;
          }
        }
        local_c8.write_.shared_alloc_.direct_ptr = (void *)local_208._8_8_;
        collect_marked((Omega_h *)&local_1e8,&local_c8);
        pAVar2 = local_c8.write_.shared_alloc_.alloc;
        if (((ulong)local_c8.write_.shared_alloc_.alloc & 7) == 0 &&
            local_c8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_c8.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_c8.write_.shared_alloc_.alloc);
            operator_delete(pAVar2,0x48);
          }
        }
        if (((ulong)local_98.ab2b.write_.shared_alloc_.alloc & 1) == 0) {
          uVar11 = (local_98.ab2b.write_.shared_alloc_.alloc)->size;
        }
        else {
          uVar11 = (ulong)local_98.ab2b.write_.shared_alloc_.alloc >> 3;
        }
        local_230._0_8_ = local_230 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"");
        Read<double>::Read(&local_d8,(LO)(uVar11 >> 2),1.0,(string *)local_230);
        if ((Alloc *)local_230._0_8_ != (Alloc *)(local_230 + 0x10)) {
          operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
        }
        local_138.write_.shared_alloc_.alloc = local_1e8;
        if (((ulong)local_1e8 & 7) == 0 && local_1e8 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_138.write_.shared_alloc_.alloc = (Alloc *)(local_1e8->size * 8 + 1);
          }
          else {
            local_1e8->use_count = local_1e8->use_count + 1;
          }
        }
        local_138.write_.shared_alloc_.direct_ptr = local_1e0;
        local_f8.write_.shared_alloc_.alloc = (initial->write_).shared_alloc_.alloc;
        if (((ulong)local_f8.write_.shared_alloc_.alloc & 7) == 0 &&
            local_f8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_f8.write_.shared_alloc_.alloc =
                 (Alloc *)((local_f8.write_.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_f8.write_.shared_alloc_.alloc)->use_count =
                 (local_f8.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_f8.write_.shared_alloc_.direct_ptr = (initial->write_).shared_alloc_.direct_ptr;
        unmap<double>((Omega_h *)&local_50,&local_138,&local_f8,width);
        read<double>((Omega_h *)&local_e8,&local_50);
        if (((ulong)local_50.shared_alloc_.alloc & 7) == 0 &&
            local_50.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_50.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_50.shared_alloc_.alloc);
            operator_delete(local_50.shared_alloc_.alloc,0x48);
          }
        }
        pAVar2 = local_f8.write_.shared_alloc_.alloc;
        if (((ulong)local_f8.write_.shared_alloc_.alloc & 7) == 0 &&
            local_f8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_f8.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_f8.write_.shared_alloc_.alloc);
            operator_delete(pAVar2,0x48);
          }
        }
        pAVar2 = local_138.write_.shared_alloc_.alloc;
        if (((ulong)local_138.write_.shared_alloc_.alloc & 7) == 0 &&
            local_138.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_138.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_138.write_.shared_alloc_.alloc);
            operator_delete(pAVar2,0x48);
          }
        }
        local_20c = 0;
        do {
          local_128.a2ab.write_.shared_alloc_.alloc = local_98.a2ab.write_.shared_alloc_.alloc;
          if (((ulong)local_98.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
              local_98.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_128.a2ab.write_.shared_alloc_.alloc =
                   (Alloc *)((local_98.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_98.a2ab.write_.shared_alloc_.alloc)->use_count =
                   (local_98.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_128.a2ab.write_.shared_alloc_.direct_ptr =
               local_98.a2ab.write_.shared_alloc_.direct_ptr;
          local_128.ab2b.write_.shared_alloc_.alloc = local_98.ab2b.write_.shared_alloc_.alloc;
          if (((ulong)local_98.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
              local_98.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_128.ab2b.write_.shared_alloc_.alloc =
                   (Alloc *)((local_98.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_98.ab2b.write_.shared_alloc_.alloc)->use_count =
                   (local_98.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_128.ab2b.write_.shared_alloc_.direct_ptr =
               local_98.ab2b.write_.shared_alloc_.direct_ptr;
          local_148.write_.shared_alloc_.alloc = local_d8.write_.shared_alloc_.alloc;
          if (((ulong)local_d8.write_.shared_alloc_.alloc & 7) == 0 &&
              local_d8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_148.write_.shared_alloc_.alloc =
                   (Alloc *)((local_d8.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_d8.write_.shared_alloc_.alloc)->use_count =
                   (local_d8.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_148.write_.shared_alloc_.direct_ptr = local_d8.write_.shared_alloc_.direct_ptr;
          local_158.write_.shared_alloc_.alloc = *(Alloc **)this;
          if (((ulong)local_158.write_.shared_alloc_.alloc & 7) == 0 &&
              local_158.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_158.write_.shared_alloc_.alloc =
                   (Alloc *)((local_158.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_158.write_.shared_alloc_.alloc)->use_count =
                   (local_158.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_158.write_.shared_alloc_.direct_ptr = *(void **)(this + 8);
          graph_weighted_average((Omega_h *)&local_108,&local_128,&local_148,&local_158,width);
          pAVar2 = local_158.write_.shared_alloc_.alloc;
          if (((ulong)local_158.write_.shared_alloc_.alloc & 7) == 0 &&
              local_158.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_158.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_158.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_148.write_.shared_alloc_.alloc;
          if (((ulong)local_148.write_.shared_alloc_.alloc & 7) == 0 &&
              local_148.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_148.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_148.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_128.ab2b.write_.shared_alloc_.alloc;
          if (((ulong)local_128.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
              local_128.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_128.ab2b.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_128.ab2b.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_128.a2ab.write_.shared_alloc_.alloc;
          if (((ulong)local_128.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
              local_128.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_128.a2ab.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_128.a2ab.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          local_168.write_.shared_alloc_.alloc = local_108;
          if (((ulong)local_108 & 7) == 0 && local_108 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_168.write_.shared_alloc_.alloc = (Alloc *)(local_108->size * 8 + 1);
            }
            else {
              local_108->use_count = local_108->use_count + 1;
            }
          }
          local_168.write_.shared_alloc_.direct_ptr = local_100;
          local_230._0_8_ = local_230 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"");
          deep_copy<double>((Omega_h *)&local_1f8,&local_168,(string *)local_230);
          if ((Alloc *)local_230._0_8_ != (Alloc *)(local_230 + 0x10)) {
            operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
          }
          pAVar2 = local_168.write_.shared_alloc_.alloc;
          if (((ulong)local_168.write_.shared_alloc_.alloc & 7) == 0 &&
              local_168.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_168.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_168.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          local_178.write_.shared_alloc_.alloc = local_e8;
          if (((ulong)local_e8 & 7) == 0 && local_e8 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_178.write_.shared_alloc_.alloc = (Alloc *)(local_e8->size * 8 + 1);
            }
            else {
              local_e8->use_count = local_e8->use_count + 1;
            }
          }
          local_178.write_.shared_alloc_.direct_ptr = local_e0;
          local_188.write_.shared_alloc_.alloc = local_1e8;
          if (((ulong)local_1e8 & 7) == 0 && local_1e8 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_188.write_.shared_alloc_.alloc = (Alloc *)(local_1e8->size * 8 + 1);
            }
            else {
              local_1e8->use_count = local_1e8->use_count + 1;
            }
          }
          local_188.write_.shared_alloc_.direct_ptr = local_1e0;
          local_198.shared_alloc_.alloc = local_1f8;
          if (((ulong)local_1f8 & 7) == 0 && local_1f8 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_198.shared_alloc_.alloc = (Alloc *)(local_1f8->size * 8 + 1);
            }
            else {
              local_1f8->use_count = local_1f8->use_count + 1;
            }
          }
          local_198.shared_alloc_.direct_ptr = local_1f0;
          map_into<double>(&local_178,&local_188,&local_198,width);
          pAVar2 = local_198.shared_alloc_.alloc;
          if (((ulong)local_198.shared_alloc_.alloc & 7) == 0 &&
              local_198.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_198.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_198.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_188.write_.shared_alloc_.alloc;
          if (((ulong)local_188.write_.shared_alloc_.alloc & 7) == 0 &&
              local_188.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_188.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_188.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_178.write_.shared_alloc_.alloc;
          if (((ulong)local_178.write_.shared_alloc_.alloc & 7) == 0 &&
              local_178.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_178.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_178.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          local_1a8.shared_alloc_.alloc = local_1f8;
          if (((ulong)local_1f8 & 7) == 0 && local_1f8 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_1a8.shared_alloc_.alloc = (Alloc *)(local_1f8->size * 8 + 1);
            }
            else {
              local_1f8->use_count = local_1f8->use_count + 1;
            }
          }
          local_1a8.shared_alloc_.direct_ptr = local_1f0;
          Read<double>::Read((Read<signed_char> *)local_230,&local_1a8);
          pAVar2 = local_1a8.shared_alloc_.alloc;
          if (((ulong)local_1a8.shared_alloc_.alloc & 7) == 0 &&
              local_1a8.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_1a8.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_1a8.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          local_1b8 = (Alloc *)local_230._0_8_;
          if ((local_230._0_8_ & 7) == 0 && (Alloc *)local_230._0_8_ != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_1b8 = (Alloc *)(*(long *)local_230._0_8_ * 8 + 1);
            }
            else {
              *(int *)(local_230._0_8_ + 0x30) = *(int *)(local_230._0_8_ + 0x30) + 1;
            }
          }
          local_1b0 = (element_type *)local_230._8_8_;
          Mesh::sync_array<double>((Mesh *)&local_78,(Int)mesh,(Read<double> *)0x0,(Int)&local_1b8);
          uVar7 = local_230._0_8_;
          if ((local_230._0_8_ & 7) == 0 && (Alloc *)local_230._0_8_ != (Alloc *)0x0) {
            piVar1 = (int *)(local_230._0_8_ + 0x30);
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc((Alloc *)local_230._0_8_);
              operator_delete((void *)uVar7,0x48);
            }
          }
          pAVar2 = local_1b8;
          local_230._0_8_ = local_78;
          local_230._8_8_ = peStack_70;
          if ((((ulong)local_78 & 7) == 0 && local_78 != (Alloc *)0x0) &&
             (entering_parallel == '\x01')) {
            local_78->use_count = local_78->use_count + -1;
            local_230._0_8_ = local_78->size * 8 + 1;
          }
          local_78 = (Alloc *)0x0;
          peStack_70 = (element_type *)0x0;
          if (((ulong)local_1b8 & 7) == 0 && local_1b8 != (Alloc *)0x0) {
            piVar1 = &local_1b8->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(pAVar2);
              operator_delete(pAVar2,0x48);
            }
          }
          local_1c8.write_.shared_alloc_.alloc = *(Alloc **)this;
          if (((ulong)local_1c8.write_.shared_alloc_.alloc & 7) == 0 &&
              local_1c8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_1c8.write_.shared_alloc_.alloc =
                   (Alloc *)((local_1c8.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_1c8.write_.shared_alloc_.alloc)->use_count =
                   (local_1c8.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_1c8.write_.shared_alloc_.direct_ptr = *(void **)(this + 8);
          local_1d8.write_.shared_alloc_.alloc = (Alloc *)local_230._0_8_;
          if ((local_230._0_8_ & 7) == 0 && (Alloc *)local_230._0_8_ != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_1d8.write_.shared_alloc_.alloc = (Alloc *)(*(long *)local_230._0_8_ * 8 + 1);
            }
            else {
              *(int *)(local_230._0_8_ + 0x30) = *(int *)(local_230._0_8_ + 0x30) + 1;
            }
          }
          local_1d8.write_.shared_alloc_.direct_ptr = (void *)local_230._8_8_;
          bVar3 = are_close(&local_1c8,&local_1d8,local_60,local_58);
          pAVar2 = local_1d8.write_.shared_alloc_.alloc;
          if (((ulong)local_1d8.write_.shared_alloc_.alloc & 7) == 0 &&
              local_1d8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_1d8.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_1d8.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_1c8.write_.shared_alloc_.alloc;
          if (((ulong)local_1c8.write_.shared_alloc_.alloc & 7) == 0 &&
              local_1c8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_1c8.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_1c8.write_.shared_alloc_.alloc);
              operator_delete(pAVar2,0x48);
            }
          }
          bVar3 = Comm::reduce_and(local_a8,bVar3);
          pAVar2 = *(Alloc **)this;
          if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
            piVar1 = &pAVar2->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(pAVar2);
              operator_delete(pAVar2,0x48);
            }
          }
          uVar7 = local_230._0_8_;
          *(undefined8 *)this = local_230._0_8_;
          bVar12 = (local_230._0_8_ & 7) == 0;
          if (bVar12 && (Alloc *)local_230._0_8_ != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              *(long *)this = *(long *)local_230._0_8_ * 8 + 1;
            }
            else {
              *(int *)(local_230._0_8_ + 0x30) = *(int *)(local_230._0_8_ + 0x30) + 1;
            }
          }
          *(undefined8 *)(this + 8) = local_230._8_8_;
          if (bVar12 && (Alloc *)local_230._0_8_ != (Alloc *)0x0) {
            piVar1 = (int *)(local_230._0_8_ + 0x30);
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc((Alloc *)local_230._0_8_);
              operator_delete((void *)uVar7,0x48);
            }
          }
          pAVar2 = local_1f8;
          if (((ulong)local_1f8 & 7) == 0 && local_1f8 != (Alloc *)0x0) {
            piVar1 = &local_1f8->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_1f8);
              operator_delete(pAVar2,0x48);
            }
          }
          pAVar2 = local_108;
          if (((ulong)local_108 & 7) == 0 && local_108 != (Alloc *)0x0) {
            piVar1 = &local_108->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_108);
              operator_delete(pAVar2,0x48);
            }
          }
          local_20c = local_20c + 1;
        } while (!bVar3);
        IVar5 = Comm::rank(local_a8);
        pvVar8 = extraout_RDX;
        if (IVar5 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"laplacian solve took ",0x15);
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_20c);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," iterations\n",0xc);
          pvVar8 = extraout_RDX_00;
        }
        if (((ulong)local_e8 & 7) == 0 && local_e8 != (Alloc *)0x0) {
          piVar1 = &local_e8->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_e8);
            operator_delete(local_e8,0x48);
            pvVar8 = extraout_RDX_01;
          }
        }
        if (((ulong)local_d8.write_.shared_alloc_.alloc & 7) == 0 &&
            local_d8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_d8.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_d8.write_.shared_alloc_.alloc);
            operator_delete(local_d8.write_.shared_alloc_.alloc,0x48);
            pvVar8 = extraout_RDX_02;
          }
        }
        if (((ulong)local_1e8 & 7) == 0 && local_1e8 != (Alloc *)0x0) {
          piVar1 = &local_1e8->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_1e8);
            operator_delete(local_1e8,0x48);
            pvVar8 = extraout_RDX_03;
          }
        }
        if ((local_208._M_allocated_capacity & 7) == 0 &&
            (Alloc *)local_208._M_allocated_capacity != (Alloc *)0x0) {
          piVar1 = (int *)(local_208._M_allocated_capacity + 0x30);
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc((Alloc *)local_208._M_allocated_capacity);
            operator_delete((void *)local_208._M_allocated_capacity,0x48);
            pvVar8 = extraout_RDX_04;
          }
        }
        if (((ulong)local_b8 & 7) == 0 && local_b8 != (Alloc *)0x0) {
          piVar1 = &local_b8->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_b8);
            operator_delete(local_b8,0x48);
            pvVar8 = extraout_RDX_05;
          }
        }
        if (((ulong)local_98.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
            local_98.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_98.ab2b.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_98.ab2b.write_.shared_alloc_.alloc);
            operator_delete(local_98.ab2b.write_.shared_alloc_.alloc,0x48);
            pvVar8 = extraout_RDX_06;
          }
        }
        if (((ulong)local_98.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
            local_98.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_98.a2ab.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_98.a2ab.write_.shared_alloc_.alloc);
            operator_delete(local_98.a2ab.write_.shared_alloc_.alloc,0x48);
            pvVar8 = extraout_RDX_07;
          }
        }
        if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
          pvVar8 = extraout_RDX_08;
        }
        RVar13.write_.shared_alloc_.direct_ptr = pvVar8;
        RVar13.write_.shared_alloc_.alloc = (Alloc *)this;
        return (Reals)RVar13.write_.shared_alloc_;
      }
      fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
           ,0x33);
    }
    pcVar9 = "initial.size() == mesh->nverts() * width";
    uVar7 = 0x10;
  }
  else {
    pcVar9 = "mesh->owners_have_all_upward(VERT)";
    uVar7 = 0xf;
  }
  fail("assertion %s failed at %s +%d\n",pcVar9,
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_laplace.cpp"
       ,uVar7);
}

Assistant:

Reals solve_laplacian(
    Mesh* mesh, Reals initial, Int width, Real tol, Real floor) {
  OMEGA_H_CHECK(mesh->owners_have_all_upward(VERT));
  OMEGA_H_CHECK(initial.size() == mesh->nverts() * width);
  auto comm = mesh->comm();
  auto state = initial;
  auto star = mesh->ask_star(VERT);
  auto interior = mark_by_class_dim(mesh, VERT, mesh->dim());
  auto boundary = invert_marks(interior);
  auto b2v = collect_marked(boundary);
  auto weights = Reals(star.ab2b.size(), 1.0);
  auto bc_data = read(unmap(b2v, initial, width));
  bool done = false;
  Int niters = 0;
  do {
    auto new_state_nobc = graph_weighted_average(star, weights, state, width);
    auto new_state_w = deep_copy(new_state_nobc);
    map_into(bc_data, b2v, new_state_w, width);
    auto new_state = Reals(new_state_w);
    new_state = mesh->sync_array(VERT, new_state, width);
    auto local_done = are_close(state, new_state, tol, floor);
    done = comm->reduce_and(local_done);
    state = new_state;
    ++niters;
  } while (!done);
  if (comm->rank() == 0) {
    std::cout << "laplacian solve took " << niters << " iterations\n";
  }
  return state;
}